

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# discrete_fourier_transform.h
# Opt level: O3

void __thiscall
sptk::DiscreteFourierTransform::~DiscreteFourierTransform(DiscreteFourierTransform *this)

{
  pointer pdVar1;
  
  this->_vptr_DiscreteFourierTransform = (_func_int **)&PTR__DiscreteFourierTransform_00112d28;
  pdVar1 = (this->cosine_table_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1);
  }
  pdVar1 = (this->sine_table_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pdVar1 != (pointer)0x0) {
    operator_delete(pdVar1);
    return;
  }
  return;
}

Assistant:

virtual ~DiscreteFourierTransform() {
  }